

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::iterate
          (ImageBindingRenderCase *this)

{
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar10;
  undefined8 uVar11;
  TestLog *this_00;
  MessageBuilder *pMVar12;
  reference expectedColor;
  bool bVar13;
  MessageBuilder local_1e0;
  int local_50;
  value_type local_4c;
  GLint val;
  GLint binding;
  string name;
  bool local_1f;
  bool local_1e;
  int iterNdx;
  bool imageTestPassed;
  bool queryTestPassed;
  bool arrayInstance;
  int iterations;
  Functions *gl;
  ImageBindingRenderCase *this_local;
  long lVar9;
  
  pRVar8 = gles31::Context::getRenderContext
                     ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  iVar4 = (this->super_LayoutBindingRenderCase).m_numBindings;
  bVar13 = true;
  if ((this->super_LayoutBindingRenderCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    bVar13 = (this->super_LayoutBindingRenderCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  local_1e = true;
  local_1f = true;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < iVar4;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    (**(code **)(lVar9 + 0x14f0))
              ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,name.field_2._12_4_)
    ;
    if (bVar13) {
      getUniformName((string *)&val,&(this->super_LayoutBindingRenderCase).m_uniformName,0,
                     name.field_2._12_4_);
    }
    else {
      getUniformName((string *)&val,&(this->super_LayoutBindingRenderCase).m_uniformName,
                     name.field_2._12_4_);
    }
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&(this->super_LayoutBindingRenderCase).m_bindings,
                         (long)(int)name.field_2._12_4_);
    local_4c = *pvVar10;
    local_50 = -1;
    pcVar1 = *(code **)(lVar9 + 0xb68);
    dVar5 = glu::ShaderProgram::getProgram((this->super_LayoutBindingRenderCase).m_program);
    pcVar2 = *(code **)(lVar9 + 0xb48);
    dVar6 = glu::ShaderProgram::getProgram((this->super_LayoutBindingRenderCase).m_program);
    uVar11 = std::__cxx11::string::c_str();
    uVar7 = (*pcVar2)(dVar6,uVar11);
    (*pcVar1)(dVar5,uVar7,&local_50);
    this_00 = tcu::TestContext::getLog
                        ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_1e0,(char (*) [28])"Querying binding point for ");
    pMVar12 = tcu::MessageBuilder::operator<<
                        (pMVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&val);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a18ff4);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_50);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [5])0x2c1216c);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_4c);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Binding point query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x593);
    if (local_50 != local_4c) {
      local_1e = false;
    }
    expectedColor =
         std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                   (&this->m_textureColors,(long)(int)name.field_2._12_4_);
    bVar3 = LayoutBindingRenderCase::drawAndVerifyResult
                      (&this->super_LayoutBindingRenderCase,expectedColor);
    if (!bVar3) {
      local_1f = false;
    }
    std::__cxx11::string::~string((string *)&val);
  }
  LayoutBindingRenderCase::setTestResult(&this->super_LayoutBindingRenderCase,local_1e,local_1f);
  return STOP;
}

Assistant:

TestCase::IterateResult ImageBindingRenderCase::iterate	(void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	// Set the viewport and enable the shader program
	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Set the uniform value indicating the current array index
		gl.uniform1i(m_shaderProgramArrayNdxLoc, iterNdx);

		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getUniformiv(m_program->getProgram(), gl.getUniformLocation(m_program->getProgram(), name.c_str()), &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		// Draw and verify
		if (val != binding)
			queryTestPassed = false;
		if (!drawAndVerifyResult(m_textureColors[iterNdx]))
			imageTestPassed = false;
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}